

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

void __thiscall QMdi::ControllerWidget::mouseReleaseEvent(ControllerWidget *this,QMouseEvent *event)

{
  long lVar1;
  MouseButton MVar2;
  SubControl SVar3;
  QPointF *in_RSI;
  ControllerWidget *in_RDI;
  long in_FS_OFFSET;
  SubControl under_mouse;
  undefined4 in_stack_ffffffffffffffb8;
  SubControl in_stack_ffffffffffffffbc;
  ControllerWidget *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  MVar2 = QSinglePointEvent::button((QSinglePointEvent *)in_RSI);
  if (MVar2 == LeftButton) {
    QSinglePointEvent::position((QSinglePointEvent *)0x62b772);
    QPointF::toPoint(in_RSI);
    SVar3 = getSubControl(this_00,(QPoint *)in_RSI);
    if (SVar3 == in_RDI->activeControl) {
      in_stack_ffffffffffffffbc = in_RDI->activeControl;
      if (in_stack_ffffffffffffffbc == SC_ComboBoxFrame) {
        _q_minimize((ControllerWidget *)0x62b7f9);
      }
      else if (in_stack_ffffffffffffffbc == SC_ComboBoxEditField) {
        _q_restore((ControllerWidget *)0x62b7ed);
      }
      else if (in_stack_ffffffffffffffbc == SC_ComboBoxArrow) {
        _q_close((ControllerWidget *)0x62b7e1);
      }
    }
    in_RDI->activeControl = SC_None;
    QWidget::update((QWidget *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  }
  else {
    QEvent::ignore((QEvent *)in_RSI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ControllerWidget::mouseReleaseEvent(QMouseEvent *event)
{
    if (event->button() != Qt::LeftButton) {
        event->ignore();
        return;
    }

    QStyle::SubControl under_mouse = getSubControl(event->position().toPoint());
    if (under_mouse == activeControl) {
        switch (activeControl) {
        case QStyle::SC_MdiCloseButton:
            emit _q_close();
            break;
        case QStyle::SC_MdiNormalButton:
            emit _q_restore();
            break;
        case QStyle::SC_MdiMinButton:
            emit _q_minimize();
            break;
        default:
            break;
        }
    }

    activeControl = QStyle::SC_None;
    update();
}